

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

nng_stat * nng_stat_find_scope(nng_stat *stat,char *name,int id)

{
  int iVar1;
  nng_stat *stat_00;
  nng_stat *pnVar2;
  
  if ((stat != (nng_stat *)0x0) && (stat->s_info->si_type == NNG_STAT_SCOPE)) {
    if (((stat->s_val).sv_id == id) && (iVar1 = strcmp(name,stat->s_info->si_name), iVar1 == 0)) {
      return stat;
    }
    for (stat_00 = (nng_stat *)nni_list_first(&stat->s_children); stat_00 != (nng_stat *)0x0;
        stat_00 = (nng_stat *)nni_list_next(&stat->s_children,stat_00)) {
      pnVar2 = nng_stat_find_scope(stat_00,name,id);
      if (pnVar2 != (nng_stat *)0x0) {
        return pnVar2;
      }
    }
  }
  return (nng_stat *)0x0;
}

Assistant:

const nng_stat *
nng_stat_find_scope(const nng_stat *stat, const char *name, int id)
{
#if NNG_ENABLE_STATS
	nng_stat *child;
	if (stat == NULL || stat->s_info->si_type != NNG_STAT_SCOPE) {
		return (NULL);
	}
	if ((stat->s_val.sv_id == id) &&
	    (stat->s_info->si_type == NNG_STAT_SCOPE) &&
	    (strcmp(name, stat->s_info->si_name) == 0)) {
		return (stat);
	}
	NNI_LIST_FOREACH (&stat->s_children, child) {
		const nng_stat *result;
		if ((result = nng_stat_find_scope(child, name, id)) != NULL) {
			return (result);
		}
	}
#else
	NNI_ARG_UNUSED(stat);
	NNI_ARG_UNUSED(name);
	NNI_ARG_UNUSED(id);
#endif
	return (NULL);
}